

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCase::ShaderRenderCase
          (ShaderRenderCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,ShaderEvaluator *evaluator,UniformSetup *uniformSetup,
          AttributeSetupFunc attribFunc)

{
  ShaderEvaluator *pSVar1;
  UniformSetup *local_98;
  DefaultDeleter<const_vkt::sr::UniformSetup> local_5a;
  undefined1 local_59;
  UniformSetup *local_58;
  DefaultDeleter<const_vkt::sr::ShaderEvaluator> local_39;
  ShaderEvaluator *local_38;
  ShaderEvaluator *evaluator_local;
  string *psStack_28;
  bool isVertexCase_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  ShaderRenderCase *this_local;
  
  local_38 = evaluator;
  evaluator_local._7_1_ = isVertexCase;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)testCtx;
  testCtx_local = (TestContext *)this;
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_016a9a00;
  std::__cxx11::string::string((string *)&this->m_vertShaderSource);
  std::__cxx11::string::string((string *)&this->m_fragShaderSource);
  pSVar1 = local_38;
  this->m_isVertexCase = (bool)(evaluator_local._7_1_ & 1);
  de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>::DefaultDeleter(&local_39);
  de::details::
  UniquePtr<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>::
  UniquePtr(&this->m_evaluator,pSVar1);
  local_59 = 0;
  if (uniformSetup == (UniformSetup *)0x0) {
    local_98 = (UniformSetup *)operator_new(0x10);
    local_59 = 1;
    local_58 = local_98;
    UniformSetup::UniformSetup(local_98);
  }
  else {
    local_98 = uniformSetup;
  }
  de::DefaultDeleter<const_vkt::sr::UniformSetup>::DefaultDeleter(&local_5a);
  de::details::
  UniquePtr<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>::
  UniquePtr(&this->m_uniformSetup,local_98);
  this->m_attribFunc = attribFunc;
  return;
}

Assistant:

ShaderRenderCase::ShaderRenderCase (tcu::TestContext&			testCtx,
									const std::string&			name,
									const std::string&			description,
									const bool					isVertexCase,
									const ShaderEvaluator*		evaluator,
									const UniformSetup*			uniformSetup,
									const AttributeSetupFunc	attribFunc)
	: vkt::TestCase		(testCtx, name, description)
	, m_isVertexCase	(isVertexCase)
	, m_evaluator		(evaluator)
	, m_uniformSetup	(uniformSetup ? uniformSetup : new UniformSetup())
	, m_attribFunc		(attribFunc)
{}